

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_Pkcs7.cpp
# Opt level: O2

bool __thiscall axl::cry::Pkcs7::loadPem(Pkcs7 *this,void *p,size_t size)

{
  Handle<pkcs7_st_*,_axl::cry::FreePkcs7,_axl::sl::Zero<pkcs7_st_*>_> HVar1;
  PKCS7 *pPVar2;
  Handle<pkcs7_st_*,_axl::cry::FreePkcs7,_axl::sl::Zero<pkcs7_st_*>_> *x;
  Bio bio;
  PKCS7 *pkcs7;
  Handle<bio_st_*,_axl::cry::FreeBio,_axl::sl::Zero<bio_st_*>_> local_28;
  Handle<pkcs7_st_*,_axl::cry::FreePkcs7,_axl::sl::Zero<pkcs7_st_*>_> local_20;
  
  sl::Handle<pkcs7_st_*,_axl::cry::FreePkcs7,_axl::sl::Zero<pkcs7_st_*>_>::close
            (&this->super_Handle<pkcs7_st_*,_axl::cry::FreePkcs7,_axl::sl::Zero<pkcs7_st_*>_>,(int)p
            );
  local_28.m_h = (bio_st *)0x0;
  Bio::createMemBuf((Bio *)&local_28,p,size);
  local_20.m_h = (pkcs7_st *)PKCS7_new();
  x = &local_20;
  pPVar2 = PEM_read_bio_PKCS7((BIO *)local_28.m_h,(PKCS7 **)x,(undefined1 *)0x0,(void *)0x0);
  HVar1.m_h = local_20.m_h;
  if (pPVar2 == (PKCS7 *)0x0) {
    setLastCryptoError();
  }
  else {
    sl::Handle<pkcs7_st_*,_axl::cry::FreePkcs7,_axl::sl::Zero<pkcs7_st_*>_>::close
              (&this->super_Handle<pkcs7_st_*,_axl::cry::FreePkcs7,_axl::sl::Zero<pkcs7_st_*>_>,
               (int)x);
    (this->super_Handle<pkcs7_st_*,_axl::cry::FreePkcs7,_axl::sl::Zero<pkcs7_st_*>_>).m_h =
         HVar1.m_h;
  }
  sl::Handle<bio_st_*,_axl::cry::FreeBio,_axl::sl::Zero<bio_st_*>_>::~Handle(&local_28);
  return pPVar2 != (PKCS7 *)0x0;
}

Assistant:

bool
Pkcs7::loadPem(
	const void* p,
	size_t size
) {
	close();

	Bio bio;
	bio.createMemBuf(p, size);

	PKCS7* pkcs7 = PKCS7_new();
	PKCS7* result = PEM_read_bio_PKCS7(bio, &pkcs7, NULL, NULL);
	if (!result) {
		ASSERT(pkcs7 == NULL); // should have been freed already
		return failWithLastCryptoError();
	}

	attach(pkcs7);
	return true;
}